

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O2

void on_connect_with_close(uv_connect_t *req,int status)

{
  char *__format;
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_b = (int64_t)req->handle;
  if ((uv_tcp_t *)eval_b == &tcp) {
    eval_a = (int64_t)status;
    eval_b = -0x6f;
    if (eval_a == -0x6f) {
      connect_cb_calls = connect_cb_calls + 1;
      eval_a = (int64_t)close_cb_calls;
      eval_b = 0;
      if (eval_a == 0) {
        uv_close(&tcp,on_close);
        return;
      }
      pcVar2 = "0";
      pcVar1 = "close_cb_calls";
      uVar3 = 0x49;
    }
    else {
      pcVar2 = "UV_ECONNREFUSED";
      pcVar1 = "status";
      uVar3 = 0x46;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar1 = "(uv_stream_t*) &tcp";
    uVar3 = 0x45;
    pcVar2 = "req->handle";
    eval_a = (int64_t)&tcp;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connection-fail.c"
          ,uVar3,pcVar1,"==",pcVar2,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void on_connect_with_close(uv_connect_t *req, int status) {
  ASSERT_PTR_EQ((uv_stream_t*) &tcp, req->handle);
  ASSERT_EQ(status, UV_ECONNREFUSED);
  connect_cb_calls++;

  ASSERT_OK(close_cb_calls);
  uv_close((uv_handle_t*)req->handle, on_close);
}